

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::kill_key_group(Renderer *this,int i)

{
  int i_00;
  int local_18;
  int j;
  int i_local;
  Renderer *this_local;
  
  local_18 = this->voices;
  if ((this->voice[i].sample)->key_group != 0) {
    while (i_00 = local_18 + -1, local_18 != 0) {
      local_18 = i_00;
      if (((((this->voice[i_00].status & 1) == 0) || ((this->voice[i_00].status & 0xc) != 0)) &&
          (i != i_00)) &&
         ((this->voice[i].channel == this->voice[i_00].channel &&
          ((this->voice[i_00].sample)->key_group == (this->voice[i].sample)->key_group)))) {
        kill_note(this,i_00);
      }
    }
  }
  return;
}

Assistant:

void Renderer::kill_key_group(int i)
{
	int j = voices; 

	if (voice[i].sample->key_group == 0)
	{
		return;
	}
	while (j--)
	{
		if ((voice[j].status & VOICE_RUNNING) && !(voice[j].status & (VOICE_RELEASING | VOICE_STOPPING))) continue;
		if (i == j) continue;
		if (voice[i].channel != voice[j].channel) continue;
		if (voice[j].sample->key_group != voice[i].sample->key_group) continue;
		kill_note(j);
	}
}